

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

char * get_header_name(c2m_ctx_t c2m_ctx,VARR_token_t *buffer,pos_t err_pos,char **content)

{
  ulong ix;
  pos_t p;
  pos_t pos;
  size_t sVar1;
  token_t ptVar2;
  long lVar3;
  char *str;
  node_t_conflict node;
  size_t sVar4;
  size_t i;
  ulong ix_00;
  ulong ix_01;
  char *pcVar5;
  str_t sVar6;
  
  *content = (char *)0x0;
  ix_00 = 0;
  while ((sVar1 = VARR_token_tlength(buffer), ix_00 < sVar1 &&
         (ptVar2 = VARR_token_tget(buffer,ix_00), *(short *)ptVar2 == 0x20))) {
    ix_00 = ix_00 + 1;
  }
  sVar1 = VARR_token_tlength(buffer);
  if ((ix_00 < sVar1) && (ptVar2 = VARR_token_tget(buffer,ix_00), ptVar2->node_code == N_LT)) {
    pos = ptVar2->pos;
    p = ptVar2->pos;
    lVar3 = 1;
    while( true ) {
      ix = ix_00 + lVar3;
      sVar1 = VARR_token_tlength(buffer);
      if ((sVar1 <= ix) || (ptVar2 = VARR_token_tget(buffer,ix), ptVar2->node_code == N_GT)) break;
      lVar3 = lVar3 + 1;
    }
    sVar1 = VARR_token_tlength(buffer);
    if (ix < sVar1) {
      VARR_chartrunc(c2m_ctx->symbol_text,0);
      VARR_chartrunc(c2m_ctx->temp_string,0);
      VARR_charpush(c2m_ctx->symbol_text,'<');
      ix_01 = ix_00;
      while (ix_01 = ix_01 + 1, ix_01 < ix) {
        ptVar2 = VARR_token_tget(buffer,ix_01);
        for (pcVar5 = ptVar2->repr; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
          VARR_charpush(c2m_ctx->symbol_text,*pcVar5);
          VARR_charpush(c2m_ctx->temp_string,*pcVar5);
        }
      }
      VARR_charpush(c2m_ctx->symbol_text,'>');
      VARR_charpush(c2m_ctx->symbol_text,'\0');
      VARR_charpush(c2m_ctx->temp_string,'\0');
      del_tokens(buffer,(int)ix_00,(int)lVar3);
      pcVar5 = VARR_charaddr(c2m_ctx->symbol_text);
      str = VARR_charaddr(c2m_ctx->temp_string);
      sVar6 = uniq_cstr(c2m_ctx,str);
      node = new_pos_node(c2m_ctx,N_STR,p);
      (node->u).s = sVar6;
      ptVar2 = new_node_token(c2m_ctx,pos,pcVar5,0x13e,node);
      VARR_token_tset(buffer,ix_00,ptVar2);
    }
  }
  sVar1 = VARR_token_tlength(buffer);
  if (sVar1 == 0) {
    sVar1 = 0;
  }
  else {
    ptVar2 = VARR_token_tget(buffer,0);
    sVar1 = (size_t)(*(short *)ptVar2 == 0x20);
  }
  sVar4 = VARR_token_tlength(buffer);
  if ((sVar1 == sVar4 - 1) &&
     ((ptVar2 = VARR_token_tget(buffer,sVar1), *(short *)ptVar2 == 0x102 ||
      (ptVar2 = VARR_token_tget(buffer,sVar1), *(short *)ptVar2 == 0x13e)))) {
    ptVar2 = VARR_token_tget(buffer,sVar1);
    pcVar5 = get_include_fname(c2m_ctx,ptVar2,content);
    return pcVar5;
  }
  error(c2m_ctx,0x18e11f,err_pos.fname,err_pos._8_8_);
  return (char *)0x0;
}

Assistant:

static const char *get_header_name (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer, pos_t err_pos,
                                    const char **content) {
  size_t i;

  *content = NULL;
  transform_to_header (c2m_ctx, buffer);
  i = 0;
  if (VARR_LENGTH (token_t, buffer) != 0 && VARR_GET (token_t, buffer, 0)->code == ' ') i++;
  if (i != VARR_LENGTH (token_t, buffer) - 1
      || (VARR_GET (token_t, buffer, i)->code != T_STR
          && VARR_GET (token_t, buffer, i)->code != T_HEADER)) {
    error (c2m_ctx, err_pos, "wrong #include");
    return NULL;
  }
  return get_include_fname (c2m_ctx, VARR_GET (token_t, buffer, i), content);
}